

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

WhereTerm *
sqlite3WhereFindTerm(WhereClause *pWC,int iCur,int iColumn,Bitmask notReady,u32 op,Index *pIdx)

{
  WhereTerm *pWVar1;
  WhereTerm *pWVar2;
  WhereScan scan;
  WhereScan local_90;
  
  pWVar1 = whereScanInit(&local_90,pWC,iCur,iColumn,op,pIdx);
  if (pWVar1 == (WhereTerm *)0x0) {
    pWVar2 = (WhereTerm *)0x0;
  }
  else {
    pWVar2 = (WhereTerm *)0x0;
    do {
      if ((pWVar1->prereqRight & notReady) == 0) {
        if ((pWVar1->prereqRight == 0) && ((op & 0x82 & (uint)pWVar1->eOperator) != 0)) {
          return pWVar1;
        }
        if (pWVar2 == (WhereTerm *)0x0) {
          pWVar2 = pWVar1;
        }
      }
      pWVar1 = whereScanNext(&local_90);
    } while (pWVar1 != (WhereTerm *)0x0);
  }
  return pWVar2;
}

Assistant:

SQLITE_PRIVATE WhereTerm *sqlite3WhereFindTerm(
  WhereClause *pWC,     /* The WHERE clause to be searched */
  int iCur,             /* Cursor number of LHS */
  int iColumn,          /* Column number of LHS */
  Bitmask notReady,     /* RHS must not overlap with this mask */
  u32 op,               /* Mask of WO_xx values describing operator */
  Index *pIdx           /* Must be compatible with this index, if not NULL */
){
  WhereTerm *pResult = 0;
  WhereTerm *p;
  WhereScan scan;

  p = whereScanInit(&scan, pWC, iCur, iColumn, op, pIdx);
  op &= WO_EQ|WO_IS;
  while( p ){
    if( (p->prereqRight & notReady)==0 ){
      if( p->prereqRight==0 && (p->eOperator&op)!=0 ){
        testcase( p->eOperator & WO_IS );
        return p;
      }
      if( pResult==0 ) pResult = p;
    }
    p = whereScanNext(&scan);
  }
  return pResult;
}